

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

uint32_t __thiscall
spirv_cross::CompilerGLSL::get_accumulated_member_location
          (CompilerGLSL *this,SPIRVariable *var,uint32_t mbr_idx,bool strip_array)

{
  bool bVar1;
  uint32_t uVar2;
  TypedID<(spirv_cross::Types)1> TVar3;
  TypedID *this_00;
  SPIRType *type_00;
  SPIRType *local_60;
  uint32_t location_count;
  SPIRType *mbr_type;
  uint32_t i;
  uint32_t location;
  SPIRType *type;
  bool strip_array_local;
  uint32_t mbr_idx_local;
  SPIRVariable *var_local;
  CompilerGLSL *this_local;
  
  if (strip_array) {
    local_60 = Compiler::get_variable_element_type(&this->super_Compiler,var);
  }
  else {
    local_60 = Compiler::get_variable_data_type(&this->super_Compiler,var);
  }
  i = Compiler::get_decoration
                (&this->super_Compiler,(ID)(var->super_IVariant).self.id,DecorationLocation);
  for (mbr_type._4_4_ = 0; mbr_type._4_4_ < mbr_idx; mbr_type._4_4_ = mbr_type._4_4_ + 1) {
    this_00 = (TypedID *)
              VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>::operator[]
                        (&(local_60->member_types).
                          super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>,
                         (ulong)mbr_type._4_4_);
    uVar2 = TypedID::operator_cast_to_unsigned_int(this_00);
    type_00 = Compiler::get<spirv_cross::SPIRType>(&this->super_Compiler,uVar2);
    TVar3 = TypedID::operator_cast_to_TypedID((TypedID *)&(local_60->super_IVariant).self);
    bVar1 = Compiler::has_member_decoration
                      (&this->super_Compiler,(TypeID)TVar3.id,mbr_idx,DecorationLocation);
    if (bVar1) {
      TVar3 = TypedID::operator_cast_to_TypedID((TypedID *)&(local_60->super_IVariant).self);
      i = Compiler::get_member_decoration(&this->super_Compiler,TVar3.id,mbr_idx,DecorationLocation)
      ;
    }
    uVar2 = type_to_location_count(this,type_00);
    i = uVar2 + i;
  }
  return i;
}

Assistant:

uint32_t CompilerGLSL::get_accumulated_member_location(const SPIRVariable &var, uint32_t mbr_idx, bool strip_array) const
{
	auto &type = strip_array ? get_variable_element_type(var) : get_variable_data_type(var);
	uint32_t location = get_decoration(var.self, DecorationLocation);

	for (uint32_t i = 0; i < mbr_idx; i++)
	{
		auto &mbr_type = get<SPIRType>(type.member_types[i]);

		// Start counting from any place we have a new location decoration.
		if (has_member_decoration(type.self, mbr_idx, DecorationLocation))
			location = get_member_decoration(type.self, mbr_idx, DecorationLocation);

		uint32_t location_count = type_to_location_count(mbr_type);
		location += location_count;
	}

	return location;
}